

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_full_handshake_impl(int require_client_authentication)

{
  bool bVar1;
  ulong uVar2;
  uint require_client_authentication_00;
  
  sc_callcnt = 0;
  test_handshake((ptls_iovec_t)ZEXT816(0),0,0,0,require_client_authentication);
  bVar1 = require_client_authentication != 0;
  uVar2 = (ulong)bVar1;
  _ok((uint)(sc_callcnt == uVar2 + 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c");
  require_client_authentication_00 = (uint)bVar1;
  test_handshake((ptls_iovec_t)ZEXT816(0),0,0,0,require_client_authentication_00);
  _ok((uint)(sc_callcnt == uVar2 * 2 + 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c");
  test_handshake((ptls_iovec_t)ZEXT816(0),0,0,1,require_client_authentication_00);
  _ok((uint)(sc_callcnt == uVar2 * 3 + 3),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
      (ulong)((uint)(require_client_authentication == 0) * 2 + 0x352));
  return;
}

Assistant:

static void test_full_handshake_impl(int require_client_authentication)
{
    sc_callcnt = 0;

    test_handshake(ptls_iovec_init(NULL, 0), TEST_HANDSHAKE_1RTT, 0, 0, require_client_authentication);
    if (require_client_authentication) {
        ok(sc_callcnt == 2);
    } else {
        ok(sc_callcnt == 1);
    }

    test_handshake(ptls_iovec_init(NULL, 0), TEST_HANDSHAKE_1RTT, 0, 0, require_client_authentication);
    if (require_client_authentication) {
        ok(sc_callcnt == 4);
    } else {
        ok(sc_callcnt == 2);
    }

    test_handshake(ptls_iovec_init(NULL, 0), TEST_HANDSHAKE_1RTT, 0, 1, require_client_authentication);
    if (require_client_authentication) {
        ok(sc_callcnt == 6);
    } else {
        ok(sc_callcnt == 3);
    }
}